

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::lazyPrintRunInfo(ConsoleReporter *this)

{
  ColourImpl *pCVar1;
  ostream *poVar2;
  long lVar3;
  ColourGuard local_28;
  
  local_28.m_colourImpl = (ColourImpl *)CONCAT71(local_28.m_colourImpl._1_7_,10);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_StreamingReporterBase).super_ReporterBase.m_stream,
                      (char *)&local_28,1);
  lVar3 = 0x4f;
  do {
    std::ostream::put((char)poVar2);
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  local_28.m_colourImpl = (ColourImpl *)CONCAT71(local_28.m_colourImpl._1_7_,10);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_28,1);
  pCVar1 = (this->super_StreamingReporterBase).super_ReporterBase.m_colour.m_ptr;
  if (pCVar1 != (ColourImpl *)0x0) {
    local_28.m_code = FileName;
    local_28.m_engaged = false;
    local_28.m_colourImpl = pCVar1;
    ColourImpl::ColourGuard::engageImpl(&local_28,poVar2);
    poVar2 = (ostream *)
             std::ostream::write((char *)poVar2,
                                 (long)(this->super_StreamingReporterBase).currentTestRunInfo.name.
                                       m_start);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," is a Catch2 v",0xe);
    libraryVersion();
    operator<<(poVar2,&libraryVersion::version);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," host application.\n",0x13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Run with -? for options\n\n",0x19);
    if (local_28.m_engaged == true) {
      (*(local_28.m_colourImpl)->_vptr_ColourImpl[2])(local_28.m_colourImpl,0);
    }
    this->m_testRunInfoPrinted = true;
    return;
  }
  __assert_fail("m_ptr",
                "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.hpp"
                ,0x385,
                "T *Catch::Detail::unique_ptr<Catch::ColourImpl>::operator->() [T = Catch::ColourImpl]"
               );
}

Assistant:

void ConsoleReporter::lazyPrintRunInfo() {
    m_stream << '\n'
             << lineOfChars( '~' ) << '\n'
             << m_colour->guardColour( Colour::SecondaryText )
             << currentTestRunInfo.name << " is a Catch2 v" << libraryVersion()
             << " host application.\n"
             << "Run with -? for options\n\n";

    m_testRunInfoPrinted = true;
}